

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::CBString::caselessreversefind(CBString *this,char *b,int pos)

{
  CBStringException *this_00;
  size_t sVar1;
  undefined4 local_b4;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  int pos_local;
  char *b_local;
  CBString *this_local;
  
  if (b != (char *)0x0) {
    if ((uint)(this->super_tagbstring).slen < (uint)pos) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = pos;
      if (*b != '\0') {
        if (pos == (this->super_tagbstring).slen) {
          this_local._4_4_ = -1;
        }
        else {
          if (b == (char *)0x0) {
            local_b4 = 0;
          }
          else {
            sVar1 = strlen(b);
            local_b4 = (undefined4)sVar1;
          }
          bstr__cppwrapper_exception.msg.field_2._12_4_ = local_b4;
          bstr__cppwrapper_exception.msg.field_2._8_4_ = 0xffffffff;
          this_local._4_4_ =
               binstrrcaseless(&this->super_tagbstring,pos,
                               (const_bstring)((long)&bstr__cppwrapper_exception.msg.field_2 + 8));
        }
      }
    }
    return this_local._4_4_;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"CBString::CBString::caselessreversefind NULL.",&local_81);
  CBStringException::CBStringException((CBStringException *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,(CBStringException *)local_60);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::caselessreversefind (const char * b, int pos) const {
struct tagbstring t;

	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::caselessreversefind NULL.");
#else
		return BSTR_ERR;
#endif
	}

	if ((unsigned int) pos > (unsigned int) slen) return BSTR_ERR;
	if ('\0' == b[0]) return pos;
	if (pos == slen) return BSTR_ERR;

	btfromcstr (t, b);
	return binstrrcaseless ((bstring) this, pos, (bstring) &t);
}